

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::update
          (TypedTimeSamples<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *this)

{
  ::std::
  __sort<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<std::vector<unsigned_long,std::allocator<unsigned_long>>>::Sample*,std::vector<tinyusdz::TypedTimeSamples<std::vector<unsigned_long,std::allocator<unsigned_long>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<unsigned_long,std::allocator<unsigned_long>>>::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<tinyusdz::TypedTimeSamples<std::vector<unsigned_long,std::allocator<unsigned_long>>>::update()const::_lambda(tinyusdz::TypedTimeSamples<std::vector<unsigned_long,std::allocator<unsigned_long>>>::Sample_const&,tinyusdz::TypedTimeSamples<std::vector<unsigned_long,std::allocator<unsigned_long>>>::Sample_const&)_1_>>
            ((this->_samples).
             super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->_samples).
             super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this->_dirty = false;
  return;
}

Assistant:

void update() const {
    std::sort(_samples.begin(), _samples.end(),
              [](const Sample &a, const Sample &b) { return a.t < b.t; });

    _dirty = false;

    return;
  }